

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void par_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = (uint)value;
  if (((uint)env->features >> 0x1a & 1) == 0) {
    if ((env->features & 0x20) == 0) {
      raw_write(env,ri,(ulong)(uVar2 & 0xfffff1ff));
      return;
    }
    raw_write(env,ri,(ulong)(uVar2 & 0xfffff6ff));
    return;
  }
  lVar1 = ri->fieldoffset;
  if (lVar1 == 0) {
    __assert_fail("ri->fieldoffset",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x35,"void raw_write(CPUARMState *, const ARMCPRegInfo *, uint64_t)");
  }
  if ((ri->state != 1) && ((ri->type & 4) == 0)) {
    *(uint *)((long)env->regs + lVar1) = uVar2;
    return;
  }
  *(uint64_t *)((long)env->regs + lVar1) = value;
  return;
}

Assistant:

static void par_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        raw_write(env, ri, value);
    } else if (arm_feature(env, ARM_FEATURE_V7)) {
        raw_write(env, ri, value & 0xfffff6ff);
    } else {
        raw_write(env, ri, value & 0xfffff1ff);
    }
}